

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void announce_login(CHAR_DATA *ch)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  char *__s;
  size_t sVar2;
  basic_string_view<char> format;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  long *local_288;
  undefined8 uStack_280;
  long local_278 [2];
  long *local_268 [2];
  long local_258 [2];
  long *local_248;
  undefined8 uStack_240;
  buffer<char> local_238;
  char local_218 [504];
  
  if (ch->cabal < 8 && ch->cabal != 0) {
    bVar1 = is_immortal(ch);
    if (!bVar1) {
      ch_00 = get_cabal_guardian((int)ch->cabal);
      if (ch_00 != (CHAR_DATA *)0x0) {
        __s = talloc_string(cabal_messages[ch->cabal].login);
        sVar2 = strlen(__s);
        local_268[0] = (long *)ch->name;
        local_238.size_ = 0;
        local_238._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
        local_238.capacity_ = 500;
        format.size_ = sVar2;
        format.data_ = __s;
        args.field_1.values_ =
             (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_268;
        args.desc_ = 0xc;
        local_238.ptr_ = local_218;
        ::fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                  (&local_238,format,args);
        local_288 = local_278;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,local_238.ptr_,local_238.ptr_ + local_238.size_);
        if (local_238.ptr_ != local_218) {
          operator_delete(local_238.ptr_,local_238.capacity_);
        }
        local_248 = local_288;
        uStack_240 = uStack_280;
        local_238.size_ = 0;
        local_238._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
        local_238.capacity_ = 500;
        fmt.size_ = 0x10;
        fmt.data_ = "\x1b[1;37m{}\x1b[0;37m";
        args_00.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_248;
        args_00.desc_ = 0xd;
        local_238.ptr_ = local_218;
        ::fmt::v9::detail::vformat_to<char>(&local_238,fmt,args_00,(locale_ref)0x0);
        local_268[0] = local_258;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_268,local_238.ptr_,local_238.ptr_ + local_238.size_);
        if (local_238.ptr_ != local_218) {
          operator_delete(local_238.ptr_,local_238.capacity_);
        }
        std::__cxx11::string::operator=((string *)&local_288,(string *)local_268);
        if (local_268[0] != local_258) {
          operator_delete(local_268[0],local_258[0] + 1);
        }
        do_cb(ch_00,(char *)local_288);
        if (local_288 != local_278) {
          operator_delete(local_288,local_278[0] + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void announce_login(CHAR_DATA *ch)
{
	CHAR_DATA *guardian;
	char *rstring;

	if (ch->cabal == 0 || ch->cabal > MAX_CABAL || is_immortal(ch))
		return;

	guardian = get_cabal_guardian(ch->cabal);

	if (!guardian)
		return;

	rstring = talloc_string(cabal_messages[ch->cabal].login);

	auto buffer = fmt::sprintf(rstring, ch->name);
	buffer = fmt::format("\x01B[1;37m{}\x01B[0;37m", buffer);
	do_cb(guardian, buffer.data());
}